

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

ptrdiff_t mp_check_array(char *cur,char *end)

{
  byte bVar1;
  uint32_t hsize;
  uint8_t c;
  char *end_local;
  char *cur_local;
  byte local_9;
  
  end_local = cur;
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x791,"ptrdiff_t mp_check_array(const char *, const char *)");
  }
  local_9 = *cur;
  if (mp_type_hint[local_9] == MP_ARRAY) {
    bVar1 = mp_load_u8(&end_local);
    if ((bVar1 & 0x40) == 0) {
      cur_local = end_local + -(long)end;
    }
    else {
      if ((bVar1 < 0xdc) || (0xdd < bVar1)) {
        __assert_fail("c >= 0xdc && c <= 0xdd",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0x797,"ptrdiff_t mp_check_array(const char *, const char *)");
      }
      cur_local = (char *)((ulong)(uint)(2 << (bVar1 & 1)) - ((long)end - (long)end_local));
    }
    return (ptrdiff_t)cur_local;
  }
  __assert_fail("mp_typeof(*cur) == MP_ARRAY",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x792,"ptrdiff_t mp_check_array(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_array(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_ARRAY);
	uint8_t c = mp_load_u8(&cur);
	if (mp_likely(!(c & 0x40)))
		return cur - end;

	assert(c >= 0xdc && c <= 0xdd); /* must be checked above by mp_typeof */
	uint32_t hsize = 2U << (c & 0x1); /* 0xdc->2, 0xdd->4 */
	return hsize - (end - cur);
}